

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void lj_state_free(global_State *g,lua_State *L)

{
  size_t *psVar1;
  uint32_t uVar2;
  size_t sVar3;
  
  if ((lua_State *)(ulong)(g->cur_L).gcptr32 == L) {
    (g->cur_L).gcptr32 = 0;
  }
  lj_func_closeuv(L,(TValue *)(ulong)(L->stack).ptr32);
  uVar2 = (L->stack).ptr32;
  sVar3 = (ulong)L->stacksize * 8;
  (g->gc).total = (g->gc).total - (int)sVar3;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar3;
  (*g->allocf)(g->allocd,(void *)uVar2,sVar3,0);
  (g->gc).total = (g->gc).total - 0x40;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + 0x40;
  (*g->allocf)(g->allocd,L,0x40,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_state_free(global_State *g, lua_State *L)
{
  lj_assertG(L != mainthread(g), "free of main thread");
  if (obj2gco(L) == gcref(g->cur_L))
    setgcrefnull(g->cur_L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_assertG(gcref(L->openupval) == NULL, "stale open upvalues");
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lj_mem_freet(g, L);
}